

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# om.h
# Opt level: O2

void __thiscall om::concurrency::queue<int>::enqueue(queue<int> *this,int item_)

{
  int local_14;
  
  std::mutex::lock(&this->_mutex);
  std::deque<int,_std::allocator<int>_>::emplace_back<int>(&(this->_queue).c,&local_14);
  std::condition_variable::notify_one();
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

void enqueue(T item_)
			{
				std::lock_guard<std::mutex> lock(_mutex);
				_queue.push(std::move(item_));
				_condition.notify_one();
			}